

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O0

com_pic_t *
com_picbuf_alloc(int width,int height,int pad_l,int pad_c,int i_scu,int f_scu,int bit_depth,
                int parallel,int *err)

{
  int iVar1;
  com_pic_t *p;
  void *pvVar2;
  pel *ppVar3;
  long lVar4;
  s8 (*pasVar5) [2];
  com_pic_t *pic;
  u8 *buf;
  int total_mem_size;
  int f_scu_local;
  int i_scu_local;
  int pad_c_local;
  int pad_l_local;
  int height_local;
  int width_local;
  
  p = (com_pic_t *)align_malloc(0x218);
  if (p != (com_pic_t *)0x0) {
    p->bit_depth = bit_depth;
    p->width_luma = width;
    p->height_luma = height;
    p->width_chroma = width / 2;
    p->height_chroma = height / 2;
    p->padsize_luma = pad_l;
    p->padsize_chroma = pad_c;
    p->stride_luma = width + pad_l * 2;
    p->stride_chroma = (width / 2 + pad_c * 2) * 2;
    pvVar2 = align_malloc(p->stride_luma * (height + pad_l * 2) +
                          p->stride_chroma * (height / 2 + pad_c * 2) + f_scu * 10 + 0xba);
    p->mem_base = pvVar2;
    if (p->mem_base != (void *)0x0) {
      ppVar3 = (pel *)((long)pvVar2 + (0x1f - ((long)pvVar2 + 0x1fU & 0x1f)));
      p->y = ppVar3;
      lVar4 = (long)p->stride_luma * (long)(height + pad_l * 2);
      ppVar3 = ppVar3 + ((lVar4 + 0x1f) - ((ulong)(ppVar3 + lVar4 + 0x1f) & 0x1f));
      p->y = p->y + (pad_l * p->stride_luma + pad_l);
      p->uv = ppVar3;
      lVar4 = (long)p->stride_chroma * (long)(height / 2 + pad_c * 2);
      pasVar5 = (s8 (*) [2])(ppVar3 + ((lVar4 + 0x1f) - ((ulong)(ppVar3 + lVar4 + 0x1f) & 0x1f)));
      p->uv = p->uv + (pad_c * p->stride_chroma + pad_c * 2);
      p->map_refi = pasVar5;
      memset(p->map_refi,0xff,(long)f_scu << 1);
      p->map_refi = p->map_refi + (i_scu + 1);
      p->map_mv = (s16 (*) [2] [2])
                  ((long)pasVar5 +
                  (((long)f_scu * 2 + 0x1f) - ((ulong)(pasVar5[(long)f_scu + 0xf] + 1) & 0x1f)));
      p->map_mv = p->map_mv + (i_scu + 1);
      if (parallel == 0) {
        p->parallel_enable = 0;
LAB_0011a08c:
        if (err == (int *)0x0) {
          return p;
        }
        *err = 0;
        return p;
      }
      p->parallel_enable = 1;
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&p->mutex,(pthread_mutexattr_t *)0x0);
      if (iVar1 == 0) {
        iVar1 = pthread_cond_init((pthread_cond_t *)&p->cond,(pthread_condattr_t *)0x0);
        if (iVar1 == 0) goto LAB_0011a08c;
        pthread_mutex_destroy((pthread_mutex_t *)&p->mutex);
      }
    }
  }
  if (p != (com_pic_t *)0x0) {
    if (p->mem_base != (void *)0x0) {
      align_free(p->mem_base);
      p->mem_base = (void *)0x0;
    }
    if (p != (com_pic_t *)0x0) {
      align_free(p);
    }
  }
  if (err != (int *)0x0) {
    *err = -1;
  }
  return (com_pic_t *)0x0;
}

Assistant:

com_pic_t * com_picbuf_alloc(int width, int height, int pad_l, int pad_c, int i_scu, int f_scu, int bit_depth, int parallel, int *err)
{
    int total_mem_size = 0;
    u8 *buf;
    com_pic_t *pic = com_malloc(sizeof(com_pic_t));

    uavs3d_assert_goto(pic != NULL, ERR);

    pic->bit_depth      = bit_depth;
    pic->width_luma     = width;
    pic->height_luma    = height;
    pic->width_chroma   = width  / 2;
    pic->height_chroma  = height / 2;
    pic->padsize_luma   = pad_l;
    pic->padsize_chroma = pad_c;
    pic->stride_luma    = width + pad_l * 2;
    pic->stride_chroma  = (width / 2 + pad_c * 2) * 2;

    /* allocate maps */
    total_mem_size = sizeof(pel) * (pic->stride_luma * (height + 2 * pad_l) + pic->stride_chroma * (height / 2 + pad_c * 2)) + // yuv buffer
                     sizeof( s8) * f_scu * REFP_NUM        + ALIGN_MASK + // map_refi
                     sizeof(s16) * f_scu * REFP_NUM * MV_D + ALIGN_MASK + // map_mv
                     ALIGN_MASK * 4;

    pic->mem_base = buf = com_malloc(total_mem_size);
    uavs3d_assert_goto(pic->mem_base, ERR);

    buf = ALIGN_POINTER(buf);

    GIVE_BUFFER (pic->y,        buf, sizeof(pel) * pic->stride_luma   * (height     + pad_l * 2));  pic->y        += pad_l * pic->stride_luma   + pad_l;
    GIVE_BUFFER (pic->uv,       buf, sizeof(pel) * pic->stride_chroma * (height / 2 + pad_c * 2));  pic->uv       += pad_c * pic->stride_chroma + pad_c * 2;
    GIVE_BUFFERV(pic->map_refi, buf, sizeof( s8) * f_scu * REFP_NUM ,   -1);                        pic->map_refi += i_scu + 1;
    GIVE_BUFFER (pic->map_mv,   buf, sizeof(s16) * f_scu * REFP_NUM * MV_D);                        pic->map_mv   += i_scu + 1;

    if (parallel) {
        pic->parallel_enable = 1;
        if (!uavs3d_pthread_mutex_init(&pic->mutex, NULL)) {
            if (uavs3d_pthread_cond_init(&pic->cond, NULL)) {
                uavs3d_pthread_mutex_destroy(&pic->mutex);
                uavs3d_assert_goto(0, ERR);
            }
        } else {
            uavs3d_assert_goto(0, ERR);
        }
    } else {
        pic->parallel_enable = 0;
    }
    if (err) {
        *err = RET_OK;
    }

    return pic;
ERR:
    if (pic) {
        com_free(pic->mem_base);   
        com_free(pic);
    }
    if (err) {
        *err = ERR_OUT_OF_MEMORY;
    }
    return NULL;
}